

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateSamplePositionAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  _Rb_tree_color execution_model;
  bool bVar1;
  StorageClass SVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *this_00;
  spv_result_t sVar4;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  uint32_t local_26c;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    SVar2 = GetStorageClass(referenced_from_inst);
    if ((SVar2 != Input) && (SVar2 != Max)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,0x1109,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208,
                      "Vulkan spec allows BuiltIn SamplePosition to be only used for variables with Input storage class. "
                     );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,Max);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      std::operator<<((ostream *)local_208," ");
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_228,this,referenced_from_inst);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      sVar4 = local_38;
LAB_0026534e:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar4;
    }
    for (p_Var3 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      execution_model = p_Var3[1]._M_color;
      if (execution_model != 4) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,0x1108,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&local_268);
        std::operator<<((ostream *)local_208,
                        "Vulkan spec allows BuiltIn SamplePosition to be used only with Fragment execution model. "
                       );
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                   execution_model);
        std::operator<<((ostream *)local_208,(string *)&local_248);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        sVar4 = local_38;
        goto LAB_0026534e;
      }
    }
  }
  if (this->function_id_ == 0) {
    local_26c = (referenced_from_inst->inst_).result_id;
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_26c);
    local_248._M_dataplus._M_p = (pointer)ValidateSamplePositionAtReference;
    local_248._M_string_length = 0;
    local_228._M_dataplus._M_p = (pointer)this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              ((type *)local_208,(offset_in_BuiltInsValidator_to_subr *)&local_248,
               (BuiltInsValidator **)&local_228,decoration,built_in_inst,referenced_from_inst,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_268,
               (type *)local_208);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,(value_type *)&local_268);
    if ((code *)local_268.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_268.field_2._M_allocated_capacity)(&local_268,&local_268,3);
    }
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    *)(local_208 + 0x10));
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateSamplePositionAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4361)
             << "Vulkan spec allows BuiltIn SamplePosition to be only used "
                "for "
                "variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::Fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4360)
               << "Vulkan spec allows BuiltIn SamplePosition to be used only "
                  "with "
                  "Fragment execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateSamplePositionAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}